

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

void __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::DoDelete
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint first,uint last)

{
  int iVar1;
  long lVar2;
  
  if (last != 0xffffffff) {
    if (first <= last) {
      lVar2 = (ulong)first * 0x18;
      iVar1 = (last - first) + 1;
      do {
        FString::~FString((FString *)((long)&(this->Array->Str).Chars + lVar2));
        lVar2 = lVar2 + 0x18;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<ACSStringPool::PoolEntry>::DoDelete(unsigned int, unsigned int) [T = ACSStringPool::PoolEntry, TT = ACSStringPool::PoolEntry]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}